

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Deconvolution_x86::create_pipeline(Deconvolution_x86 *this,Option *opt)

{
  uint _c;
  _func_int **pp_Var1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  void *pvVar5;
  undefined4 *puVar6;
  ulong uVar7;
  int p;
  long lVar8;
  undefined4 *puVar9;
  undefined4 *puVar10;
  int iVar11;
  _func_int *p_Var12;
  int k;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  undefined4 *puVar18;
  int _w;
  ulong uVar19;
  ulong uVar20;
  Mat local_c0;
  Mat local_78;
  
  p_Var12 = this->_vptr_Deconvolution_x86[-3];
  uVar19 = (long)*(int *)(&this->field_0xd8 + (long)p_Var12) *
           (long)*(int *)(&this->field_0xd4 + (long)p_Var12);
  _w = (int)uVar19;
  uVar7 = (long)*(int *)(&this->field_0x110 + (long)p_Var12) / (long)_w;
  uVar7 = (long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
          (long)*(int *)(&this->field_0xd0 + (long)p_Var12);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  iVar16 = 0;
  Mat::create(&local_78,*(int *)(&this->field_0x18c + (long)p_Var12),4,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86;
  p_Var12 = pp_Var1[-3];
  lVar8 = *(long *)(&this->field_0x160 + (long)p_Var12);
  uVar14 = 0;
  if (0 < _w) {
    uVar14 = uVar19 & 0xffffffff;
  }
  pvVar5 = local_78.data;
  while( true ) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var12);
    iVar11 = (int)uVar7;
    if ((int)(_c * iVar11) <= iVar16) break;
    iVar11 = _w;
    for (uVar13 = 0; iVar11 = iVar11 + -1, uVar14 != uVar13; uVar13 = uVar13 + 1) {
      *(undefined4 *)((long)pvVar5 + (long)iVar11 * 4) = *(undefined4 *)(lVar8 + uVar13 * 4);
    }
    pvVar5 = (void *)((long)pvVar5 + uVar19 * 4);
    iVar16 = iVar16 + 1;
    p_Var12 = pp_Var1[-3];
    lVar8 = lVar8 + uVar19 * 4;
  }
  if (opt->use_packing_layout == false) {
    uVar15 = 1;
    uVar17 = uVar15;
  }
  else {
    uVar15 = (uint)((_c & 3) == 0) * 3 + 1;
    uVar17 = (uint)((uVar7 & 3) == 0) * 3 + 1;
  }
  Mat::reshape(&local_c0,&local_78,_w,iVar11,_c,(Allocator *)0x0);
  Mat::create(&this->weight_data_tm,_w,
              (int)((long)((ulong)(uint)(iVar11 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                   (long)(int)uVar17),
              *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) / (int)uVar15,
              (ulong)(uVar15 * uVar17 * 4),uVar15 * uVar17,(Allocator *)0x0);
  pp_Var1 = this->_vptr_Deconvolution_x86;
  pvVar5 = (this->weight_data_tm).data;
  sVar2 = (this->weight_data_tm).cstep;
  sVar3 = (this->weight_data_tm).elemsize;
  for (uVar7 = 0;
      (long)((uVar15 - 1) + uVar7) < (long)*(int *)(&this->field_0xd0 + (long)pp_Var1[-3]);
      uVar7 = uVar7 + uVar15) {
    puVar6 = (undefined4 *)(((uVar7 & 0xffffffff) / (ulong)uVar15) * sVar2 * sVar3 + (long)pvVar5);
    for (lVar8 = 0; lVar8 < (long)((long)iVar11 - (ulong)(uVar17 - 1));
        lVar8 = lVar8 + (ulong)uVar17) {
      puVar10 = (undefined4 *)
                ((local_c0.w * lVar8 + uVar7 * local_c0.cstep) * local_c0.elemsize +
                (long)local_c0.data);
      for (uVar19 = 0; uVar19 != uVar14; uVar19 = uVar19 + 1) {
        puVar9 = puVar10;
        for (uVar13 = 0; puVar18 = puVar9, uVar20 = (ulong)uVar15, uVar13 != uVar17;
            uVar13 = uVar13 + 1) {
          while (uVar20 != 0) {
            *puVar6 = *puVar18;
            puVar6 = puVar6 + 1;
            puVar18 = (undefined4 *)((long)puVar18 + local_c0.cstep * local_c0.elemsize);
            uVar20 = uVar20 - 1;
          }
          puVar9 = (undefined4 *)((long)puVar9 + local_c0.elemsize * (long)local_c0.w);
        }
        puVar10 = puVar10 + 1;
      }
    }
  }
  if (local_c0.refcount != (int *)0x0) {
    LOCK();
    *local_c0.refcount = *local_c0.refcount + -1;
    UNLOCK();
    if (*local_c0.refcount == 0) {
      if (local_c0.allocator == (Allocator *)0x0) {
        free(local_c0.data);
      }
      else {
        (*(local_c0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (opt->lightmode != false) {
    p_Var12 = this->_vptr_Deconvolution_x86[-3];
    piVar4 = *(int **)(&this->field_0x168 + (long)p_Var12);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var12) == (long *)0x0) {
          free(*(void **)(&this->field_0x160 + (long)p_Var12));
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var12) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var12) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var12) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var12) = 0;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int Deconvolution_x86::create_pipeline(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    Mat weight_data_transposed(weight_data.w);
    {
        float* pt = weight_data_transposed;
        const float* p = weight_data;

        for (int i = 0; i < num_input * num_output; i++)
        {
            for (int k = 0; k < maxk; k++)
            {
                pt[maxk - 1 - k] = p[k];
            }

            p += maxk;
            pt += maxk;
        }
    }

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}